

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

bool __thiscall
cmFileAPI::AddProjectQuery(cmFileAPI *this,ObjectKind kind,uint majorVersion,uint minorVersion)

{
  uint uVar1;
  __normal_iterator<cmFileAPI::Object_*,_std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>_>
  _Var2;
  bool bVar3;
  bool bVar4;
  Object local_18;
  
  switch(kind) {
  case CodeModel:
    bVar4 = majorVersion != 2;
    bVar3 = minorVersion < 8;
    break;
  case ConfigureLog:
  case InternalTest:
    goto switchD_0044bea1_caseD_1;
  case Cache:
    uVar1 = majorVersion ^ 2;
    goto LAB_0044beba;
  case CMakeFiles:
    bVar4 = majorVersion != 1;
    bVar3 = minorVersion < 2;
    break;
  case Toolchains:
    uVar1 = majorVersion ^ 1;
LAB_0044beba:
    if (uVar1 != 0 || minorVersion != 0) goto switchD_0044bea1_caseD_1;
  default:
    goto switchD_0044bea1_default;
  }
  if ((bool)(!bVar3 | bVar4)) {
switchD_0044bea1_caseD_1:
    bVar4 = false;
  }
  else {
switchD_0044bea1_default:
    local_18.Version = (unsigned_long)majorVersion;
    local_18.Kind = kind;
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<cmFileAPI::Object*,std::vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>>>,__gnu_cxx::__ops::_Iter_equals_val<cmFileAPI::Object_const>>
                      ((this->TopQuery).Known.
                       super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (this->TopQuery).Known.
                       super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_18);
    if (_Var2._M_current ==
        (this->TopQuery).Known.
        super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>>::
      emplace_back<cmFileAPI::Object&>
                ((vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>> *)&this->TopQuery,
                 &local_18);
      this->QueryExists = true;
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool cmFileAPI::AddProjectQuery(cmFileAPI::ObjectKind kind,
                                unsigned majorVersion, unsigned minorVersion)
{
  switch (kind) {
    case ObjectKind::CodeModel:
      if (majorVersion != 2 || minorVersion > CodeModelV2Minor) {
        return false;
      }
      break;
    case ObjectKind::Cache:
      if (majorVersion != 2 || minorVersion > CacheV2Minor) {
        return false;
      }
      break;
    case ObjectKind::CMakeFiles:
      if (majorVersion != 1 || minorVersion > CMakeFilesV1Minor) {
        return false;
      }
      break;
    case ObjectKind::Toolchains:
      if (majorVersion != 1 || minorVersion > ToolchainsV1Minor) {
        return false;
      }
      break;
    // These cannot be requested by the project
    case ObjectKind::ConfigureLog:
    case ObjectKind::InternalTest:
      return false;
  }

  Object query;
  query.Kind = kind;
  query.Version = majorVersion;
  if (std::find(this->TopQuery.Known.begin(), this->TopQuery.Known.end(),
                query) == this->TopQuery.Known.end()) {
    this->TopQuery.Known.emplace_back(query);
    this->QueryExists = true;
  }

  return true;
}